

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.hpp
# Opt level: O0

void __thiscall thread_pool::ThreadPool::~ThreadPool(ThreadPool *this)

{
  bool bVar1;
  reference this_00;
  thread *it_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::thread,_std::allocator<std::thread>_> *__range2_1;
  TaskQueue *it;
  iterator __end2;
  iterator __begin2;
  vector<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
  *__range2;
  ThreadPool *this_local;
  
  __end2 = std::
           vector<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
           ::begin(&this->queues_);
  it = (TaskQueue *)
       std::
       vector<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
       ::end(&this->queues_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<thread_pool::ThreadPool::TaskQueue_*,_std::vector<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>_>
                                *)&it);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<thread_pool::ThreadPool::TaskQueue_*,_std::vector<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>_>
              ::operator*(&__end2);
    TaskQueue::Done(this_00);
    __gnu_cxx::
    __normal_iterator<thread_pool::ThreadPool::TaskQueue_*,_std::vector<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin(&this->threads_);
  it_1 = (thread *)std::vector<std::thread,_std::allocator<std::thread>_>::end(&this->threads_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                        *)&it_1);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&__end2_1);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end2_1);
  }
  std::
  vector<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>::
  ~vector(&this->queues_);
  std::
  unordered_map<std::thread::id,_unsigned_long,_std::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_unsigned_long>_>_>
  ::~unordered_map(&this->thread_map_);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads_);
  return;
}

Assistant:

~ThreadPool() {
    for (auto& it : queues_) {
      it.Done();
    }
    for (auto& it : threads_) {
      it.join();
    }
  }